

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::ExternModuleDeclSyntax::setChild
          (ExternModuleDeclSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_00454018 + *(int *)(&DAT_00454018 + index * 4)))();
  return;
}

Assistant:

void ExternModuleDeclSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: externKeyword = child.token(); return;
        case 2: actualAttributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 3: header = child.node() ? &child.node()->as<ModuleHeaderSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}